

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ch.cpp
# Opt level: O0

HRESULT CreateParserStateAndRunScript
                  (char *fileName,LPCSTR fileContents,size_t fileLength,
                  JsFinalizeCallback fileContentsFinalizeCallback,char *fullPath)

{
  bool bVar1;
  JsErrorCode JVar2;
  PAL_FILE *pPVar3;
  LPCWSTR pWVar4;
  JsErrorCode jsErrorCode_2;
  JsErrorCode jsErrorCode_1;
  JsErrorCode jsErrorCode;
  JsValueRef bufferVal;
  JsContextRef current;
  JsContextRef context;
  JsRuntimeHandle runtime;
  char *pcStack_30;
  HRESULT hr;
  char *fullPath_local;
  JsFinalizeCallback fileContentsFinalizeCallback_local;
  size_t fileLength_local;
  LPCSTR fileContents_local;
  char *fileName_local;
  
  runtime._4_4_ = 0;
  context = (JsContextRef)0x0;
  current = (JsContextRef)0x0;
  bufferVal = (JsValueRef)0x0;
  pcStack_30 = fullPath;
  fullPath_local = (char *)fileContentsFinalizeCallback;
  fileContentsFinalizeCallback_local = (JsFinalizeCallback)fileLength;
  fileLength_local = (size_t)fileContents;
  fileContents_local = fileName;
  runtime._4_4_ =
       GetParserStateBuffer(fileContents,(JsFinalizeCallback)0x0,(JsValueRef *)&jsErrorCode_1);
  if ((-1 < runtime._4_4_) && (runtime._4_4_ = CreateRuntime(&context), -1 < runtime._4_4_)) {
    chRuntime = context;
    JVar2 = ChakraRTInterface::JsCreateContext(context,&current);
    if (JVar2 == JsNoError) {
      JVar2 = ChakraRTInterface::JsGetCurrentContext(&bufferVal);
      if (JVar2 == JsNoError) {
        JVar2 = ChakraRTInterface::JsSetCurrentContext(current);
        if (JVar2 == JsNoError) {
          bVar1 = WScriptJsrt::Initialize();
          if (bVar1) {
            runtime._4_4_ =
                 RunScript(fileContents_local,(LPCSTR)fileLength_local,
                           (size_t)fileContentsFinalizeCallback_local,
                           (JsFinalizeCallback)fullPath_local,(JsValueRef)0x0,pcStack_30,
                           _jsErrorCode_1);
            goto LAB_00109f1e;
          }
          runtime._4_4_ = -0x7fffbffb;
        }
        else {
          pPVar3 = PAL_get_stderr(0);
          pWVar4 = Helpers::JsErrorCodeToString(JVar2);
          PAL_fwprintf(pPVar3,
                       L"ERROR: ChakraRTInterface::JsSetCurrentContext(context) failed. JsErrorCode=0x%x (%s)\n"
                       ,(ulong)JVar2,pWVar4);
          pPVar3 = PAL_get_stderr(0);
          PAL_fflush(pPVar3);
        }
      }
      else {
        pPVar3 = PAL_get_stderr(0);
        pWVar4 = Helpers::JsErrorCodeToString(JVar2);
        PAL_fwprintf(pPVar3,
                     L"ERROR: ChakraRTInterface::JsGetCurrentContext(&current) failed. JsErrorCode=0x%x (%s)\n"
                     ,(ulong)JVar2,pWVar4);
        pPVar3 = PAL_get_stderr(0);
        PAL_fflush(pPVar3);
      }
    }
    else {
      pPVar3 = PAL_get_stderr(0);
      pWVar4 = Helpers::JsErrorCodeToString(JVar2);
      PAL_fwprintf(pPVar3,
                   L"ERROR: ChakraRTInterface::JsCreateContext(runtime, &context) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar2,pWVar4);
      pPVar3 = PAL_get_stderr(0);
      PAL_fflush(pPVar3);
    }
  }
  if (fullPath_local != (char *)0x0) {
    (*(code *)fullPath_local)(fileLength_local);
  }
LAB_00109f1e:
  if (bufferVal != (JsValueRef)0x0) {
    ChakraRTInterface::JsSetCurrentContext(bufferVal);
  }
  if (context != (JsContextRef)0x0) {
    ChakraRTInterface::JsDisposeRuntime(context);
  }
  return runtime._4_4_;
}

Assistant:

HRESULT CreateParserStateAndRunScript(const char* fileName, LPCSTR fileContents, size_t fileLength, JsFinalizeCallback fileContentsFinalizeCallback, char *fullPath)
{
    HRESULT hr = S_OK;
    JsRuntimeHandle runtime = JS_INVALID_RUNTIME_HANDLE;
    JsContextRef context = JS_INVALID_REFERENCE, current = JS_INVALID_REFERENCE;
    JsValueRef bufferVal;

    // We don't want this to free fileContents when it completes, so the finalizeCallback is nullptr
    IfFailedGoLabel(GetParserStateBuffer(fileContents, nullptr, &bufferVal), ErrorRunFinalize);

    // Bytecode buffer is created in one runtime and will be executed on different runtime.
    IfFailedGoLabel(CreateRuntime(&runtime), ErrorRunFinalize);
    chRuntime = runtime;

    IfJsErrorFailLogLabel(ChakraRTInterface::JsCreateContext(runtime, &context), ErrorRunFinalize);
    IfJsErrorFailLogLabel(ChakraRTInterface::JsGetCurrentContext(&current), ErrorRunFinalize);
    IfJsErrorFailLogLabel(ChakraRTInterface::JsSetCurrentContext(context), ErrorRunFinalize);

    // Initialized the WScript object on the new context
    if (!WScriptJsrt::Initialize())
    {
        IfFailedGoLabel(E_FAIL, ErrorRunFinalize);
    }

    // This is our last call to use fileContents, so pass in the finalizeCallback
    IfFailGo(RunScript(fileName, fileContents, fileLength, fileContentsFinalizeCallback, nullptr, fullPath, bufferVal));

    if (false)
    {
ErrorRunFinalize:
        if (fileContentsFinalizeCallback != nullptr)
        {
            fileContentsFinalizeCallback((void*)fileContents);
        }
    }
Error:
    if (current != JS_INVALID_REFERENCE)
    {
        ChakraRTInterface::JsSetCurrentContext(current);
    }

    if (runtime != JS_INVALID_RUNTIME_HANDLE)
    {
        ChakraRTInterface::JsDisposeRuntime(runtime);
    }

    return hr;
}